

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parser.cpp
# Opt level: O3

void __thiscall franca::ModelParser::ModelParser(ModelParser *this)

{
  Rule<ast::Model_()> *pRVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Rule<std::string_()> *pRVar4;
  Rule<std::string_()> *pRVar5;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::detail::function_ptr<void,_void_(*)(const_char_*,_const_char_*,_const_char_*,_const_boost::spirit::info_&)>_>,_0L>,_boost::phoenix::actor<boost::spirit::argument<0>_>,_boost::phoenix::actor<boost::spirit::argument<1>_>,_boost::phoenix::actor<boost::spirit::argument<2>_>,_boost::phoenix::actor<boost::spirit::argument<3>_>_>,_5L>_>
  f;
  long lVar6;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
  *peVar7;
  vtable_base **ppvVar8;
  Rule<ast::Version_()> *pRVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Rule<ast::Argument_()> *pRVar12;
  TypeParser *pTVar13;
  InitializerParser *pIVar14;
  parser_binder<boost::spirit::qi::raw_directive<boost::spirit::qi::list<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_mpl_::bool_<true>_>
  f_00;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  that_15;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>
  that_6;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>
  that_7;
  undefined5 in_stack_fffffffffffffd98;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  car_type cVar18;
  car_type cVar19;
  car_type cVar20;
  car_type cVar21;
  car_type cVar22;
  car_type cVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  long local_258;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
  local_250;
  car_type local_248;
  Rule<std::string_()> *local_238;
  proto_child0 local_230;
  Rule<std::string_()> *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  undefined1 local_218 [24];
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  undefined1 local_1e8 [16];
  vtable_base local_1d8;
  Rule<ast::Method_()> *local_1d0;
  undefined1 local_1c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [16];
  vtable_base local_190;
  function_buffer local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_168;
  Rule<ast::Method_()> local_160;
  Rule<ast::Method_()> *local_118;
  Rule<ast::Argument_()> *local_110;
  Rule<ast::Argument_()> *local_108;
  TypeParser *local_100;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_f8;
  TypeDefinitionParser *local_f0;
  Rule<std::string_()> *local_e8;
  Rule<ast::Enumerator_()> *local_e0;
  Rule<ast::Error_()> *local_d8;
  Rule<std::string_()> *local_d0;
  Rule<ast::Version_()> *local_c8;
  InitializerParser *local_c0;
  ExpressionParser *local_b8;
  ContractParser *local_b0;
  vtable_base local_a8;
  vtable_base local_a0;
  _Alloc_hider local_98;
  Rule<ast::Argument_()> *local_90;
  Rule<ast::Method_()> *local_88;
  Rule<ast::Argument_()> *local_80;
  Rule<ast::Version_()> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined1 *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cVar18.ch = (char_type)&local_250;
  cVar20.subject = SUB82((ulong)&local_250 >> 8,0);
  cVar22.ch = (char_type)((ulong)&local_250 >> 0x18);
  uVar24 = (undefined4)((ulong)&local_250 >> 0x20);
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-grammar","");
  pRVar1 = &this->model_;
  (this->
  super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pRVar1;
  psVar2 = &(this->
            super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_;
  paVar3 = &(this->
            super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_.field_2;
  (this->
  super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p = (pointer)paVar3;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>((string *)psVar2,lVar6,local_258 + lVar6);
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  local_50 = paVar3;
  local_48 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  (this->model_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pRVar1;
  (this->model_).name_._M_dataplus._M_p = (pointer)&(this->model_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>((string *)&(this->model_).name_,lVar6,local_258 + lVar6)
  ;
  (this->model_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Model_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  local_100 = &this->type_;
  local_f8 = pRVar1;
  TypeParser::TypeParser(local_100);
  local_f0 = &this->type_definition_;
  TypeDefinitionParser::TypeDefinitionParser(local_f0);
  local_b8 = &this->expression_;
  ExpressionParser::ExpressionParser(local_b8);
  local_c0 = &this->initializer_;
  InitializerParser::InitializerParser(local_c0);
  local_b0 = &this->contract_;
  ContractParser::ContractParser(local_b0);
  local_188._16_8_ = &this->annotation_;
  AnnotationGrammar::AnnotationGrammar((AnnotationGrammar *)local_188._16_8_);
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_c8 = &this->version_;
  (this->version_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_c8;
  (this->version_).name_._M_dataplus._M_p = (pointer)&(this->version_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->version_).name_,lVar6,local_258 + lVar6);
  (this->version_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Version_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  (this->import_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->import_;
  (this->import_).name_._M_dataplus._M_p = (pointer)&(this->import_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->import_).name_,lVar6,local_258 + lVar6);
  (this->import_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  local_d0 = &this->import_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_108 = (Rule<ast::Argument_()> *)&this->attribute_;
  (this->attribute_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_108;
  (this->attribute_).name_._M_dataplus._M_p = (pointer)&(this->attribute_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->attribute_).name_,lVar6,local_258 + lVar6);
  (this->attribute_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Attribute_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_110 = &this->argument_;
  (this->argument_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_110;
  (this->argument_).name_._M_dataplus._M_p = (pointer)&(this->argument_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->argument_).name_,lVar6,local_258 + lVar6);
  (this->argument_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Argument_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_d8 = &this->error_;
  (this->error_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_d8;
  (this->error_).name_._M_dataplus._M_p = (pointer)&(this->error_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>((string *)&(this->error_).name_,lVar6,local_258 + lVar6)
  ;
  (this->error_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_e0 = &this->enumerator_;
  (this->enumerator_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_e0;
  (this->enumerator_).name_._M_dataplus._M_p = (pointer)&(this->enumerator_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->enumerator_).name_,lVar6,local_258 + lVar6);
  (this->enumerator_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Enumerator_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_118 = &this->method_;
  (this->method_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_118;
  (this->method_).name_._M_dataplus._M_p = (pointer)&(this->method_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->method_).name_,lVar6,local_258 + lVar6);
  (this->method_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_160.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor._8_8_ = &this->broadcast_;
  (this->broadcast_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_160.f.
          super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
          .super_function_base.functor._8_8_;
  (this->broadcast_).name_._M_dataplus._M_p = (pointer)&(this->broadcast_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->broadcast_).name_,lVar6,local_258 + lVar6);
  (this->broadcast_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Broadcast_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  (this->constant_def_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->constant_def_;
  (this->constant_def_).name_._M_dataplus._M_p = (pointer)&(this->constant_def_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->constant_def_).name_,lVar6,local_258 + lVar6);
  (this->constant_def_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::ConstantDef_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  local_188._8_8_ = &this->constant_def_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_160.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor._16_8_ = &this->type_collection_;
  (this->type_collection_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_160.f.
          super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
          .super_function_base.functor._16_8_;
  (this->type_collection_).name_._M_dataplus._M_p = (pointer)&(this->type_collection_).name_.field_2
  ;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->type_collection_).name_,lVar6,local_258 + lVar6);
  (this->type_collection_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::TypeCollection_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_160.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.functor.members.obj_ptr = &this->interface_;
  (this->interface_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_160.f.
          super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
          .super_function_base.functor.members._0_8_;
  (this->interface_).name_._M_dataplus._M_p = (pointer)&(this->interface_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->interface_).name_,lVar6,local_258 + lVar6);
  (this->interface_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Interface_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  local_e8 = &this->quoted_string_;
  (this->quoted_string_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_e8;
  (this->quoted_string_).name_._M_dataplus._M_p = (pointer)&(this->quoted_string_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->quoted_string_).name_,lVar6,local_258 + lVar6);
  (this->quoted_string_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  cVar19.ch = cVar18.ch;
  cVar21.subject = cVar20.subject;
  cVar23.ch = cVar22.ch;
  uVar25 = uVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  pRVar4 = &this->fqn_;
  (this->fqn_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pRVar4;
  (this->fqn_).name_._M_dataplus._M_p = (pointer)&(this->fqn_).name_.field_2;
  lVar6 = CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  std::__cxx11::string::_M_construct<char*>((string *)&(this->fqn_).name_,lVar6,local_258 + lVar6);
  (this->fqn_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar25,CONCAT13(cVar23.ch,CONCAT21(cVar21.subject,cVar19.ch)));
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  local_160.f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)pRVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffda0,"unnamed-rule","");
  pRVar5 = &this->id_;
  (this->id_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pRVar5;
  (this->id_).name_._M_dataplus._M_p = (pointer)&(this->id_).name_.field_2;
  lVar6 = CONCAT44(uVar24,CONCAT13(cVar22.ch,CONCAT21(cVar20.subject,cVar18.ch)));
  std::__cxx11::string::_M_construct<char*>((string *)&(this->id_).name_,lVar6,local_258 + lVar6);
  (this->id_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  peVar7 = (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
            *)CONCAT44(uVar24,CONCAT13(cVar22.ch,CONCAT21(cVar20.subject,cVar18.ch)));
  local_160.name_.field_2._8_8_ = pRVar5;
  if (peVar7 != &local_250) {
    operator_delete(peVar7);
  }
  pRVar5 = local_d0;
  uVar10 = local_188._16_8_;
  local_1e8._8_8_ = local_218 + 0x10;
  local_200._0_8_ = &local_170;
  local_1e8._0_8_ = "package";
  local_1c8._16_8_ = &local_238;
  local_238 = local_d0;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_190;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1c8 + 0x10);
  local_200._8_8_ = &local_228;
  local_1c8._0_8_ =
       local_160.f.
       super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
       .super_function_base.functor._16_8_;
  local_1c8._8_8_ = (long)&local_160 + 0x10;
  local_218._8_8_ = &local_1d8;
  local_1d8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_160.f.
       super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
       .super_function_base.functor.members._0_8_;
  local_1d0 = &local_160;
  local_1a0._0_8_ = local_218;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0;
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_218._0_8_ = local_1c8;
  local_218._16_8_ = pRVar4;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_3b32745e_>(local_f8);
  local_218._0_8_ = ".*";
  local_1c8._0_8_ = local_218;
  local_218._16_8_ = &local_238;
  local_200._0_8_ = "from";
  local_1e8._0_8_ = "model";
  local_228 = (Rule<std::string_()> *)&boost::spirit::omit;
  local_200._8_8_ = "import";
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_228;
  local_238 = pRVar4;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1c8;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8;
  local_1e8._8_8_ = local_218 + 0x10;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::omit>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[3]>>>,0l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&>,2l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (pRVar5);
  pRVar9 = local_c8;
  uVar11 = local_160.name_.field_2._8_8_;
  local_218._16_8_ = &local_238;
  local_218._0_8_ = "typeCollection";
  local_218._8_8_ = uVar10;
  local_1c8._0_8_ = local_160.name_.field_2._8_8_;
  local_238 = (Rule<std::string_()> *)local_218;
  local_190.manager._0_1_ = 0x7b;
  local_200._0_8_ = &local_190;
  local_1d8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)local_c8
  ;
  local_1e8._8_8_ = &local_1d8;
  local_1c8._16_8_ = local_f0;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1c8 + 0x10);
  local_1a0._0_8_ = local_188._8_8_;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0;
  local_160.name_._M_string_length = CONCAT71(local_160.name_._M_string_length._1_7_,0x7d);
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1c8;
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_200._8_8_ = &local_228;
  local_1e8._0_8_ = local_218 + 0x10;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[15]>,0l>,franca::AnnotationGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::Version(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<franca::TypeDefinitionParser&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::ConstantDef(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_160.f.
             super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
             .super_function_base.functor._16_8_);
  local_160.name_._M_string_length = 0x3edb9b;
  local_160.name_.field_2._M_allocated_capacity = uVar10;
  local_188.members.obj_ptr = (obj_ptr_t)uVar11;
  local_160.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x3edba5;
  local_160.name_._M_dataplus._M_p =
       (pointer)local_160.f.
                super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
                .super_function_base.vtable;
  local_1a0._8_8_ = &local_60;
  local_60._M_allocated_capacity = (size_type)&local_160;
  local_1a0._0_8_ = &local_190;
  local_68 = &stack0xfffffffffffffd9f;
  local_168 = &local_70;
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar11;
  local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)0x3edbad;
  local_1b0._M_allocated_capacity = (size_type)&local_40;
  local_40._M_allocated_capacity = (size_type)&local_170;
  local_1d0 = (Rule<ast::Method_()> *)&stack0xfffffffffffffd9e;
  local_1d8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       (local_1c8 + 0x10);
  local_1c8._8_8_ = &local_78;
  local_78 = pRVar9;
  local_1c8._0_8_ = &local_1d8;
  local_218._8_8_ = &local_80;
  local_80 = local_108;
  local_218._0_8_ = local_1c8;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_88;
  local_88 = local_118;
  local_238 = (Rule<std::string_()> *)local_218;
  local_200._0_8_ = &local_90;
  local_90 = (Rule<ast::Argument_()> *)
             local_160.f.
             super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
             .super_function_base.functor._8_8_;
  local_218._16_8_ = &local_238;
  local_1e8._8_8_ = &local_98;
  local_98._M_p = (pointer)local_b0;
  local_1e8._0_8_ = local_218 + 0x10;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_a0;
  local_a0.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)local_f0
  ;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_a8;
  local_a8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_188._8_8_;
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_200._8_8_ = &local_228;
  local_1c8._16_8_ = (vtable_base *)local_1a0;
  local_190.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       ((long)&local_160 + 0x10);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_9ff26b60_>
            (local_160.f.
             super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
             .super_function_base.functor.members.obj_ptr);
  local_218._0_8_ = "version";
  local_1c8[0x10] = 0x7b;
  local_238 = (Rule<std::string_()> *)local_218;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_1c8 + 0x10);
  local_1c8._0_8_ = "major";
  local_218._16_8_ = &local_238;
  local_200._0_8_ = local_1c8;
  local_1e8._0_8_ = local_218 + 0x10;
  local_1e8._8_8_ = &boost::spirit::int_;
  local_1d8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x3edbc3
  ;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_1d8;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&boost::spirit::int_;
  local_1a0[0] = '}';
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_200._8_8_ = &local_228;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Version(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[6]>>>,0l>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[6]>>>,0l>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (pRVar9);
  uVar10 = local_188._16_8_;
  local_238 = (Rule<std::string_()> *)0x3edbc9;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_188._16_8_;
  local_218._16_8_ = &local_238;
  local_200._0_8_ = local_100;
  local_1a0[0] = 0x5b;
  local_190.manager._0_1_ = 0x5d;
  local_218._0_8_ = &boost::spirit::matches;
  local_218._8_8_ = local_1c8;
  local_1e8._0_8_ = local_218 + 0x10;
  local_1e8._8_8_ = local_218;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar11;
  local_1d8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &boost::spirit::matches;
  local_1d0 = (Rule<ast::Method_()> *)0x3eacd9;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_1d8;
  local_1c8._16_8_ = &boost::spirit::matches;
  local_1b0._M_allocated_capacity = 0x3eace3;
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_200._8_8_ = &local_228;
  local_1c8._0_8_ = (vtable_base *)local_1a0;
  local_1c8._8_8_ = &local_190;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Attribute(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,franca::AnnotationGrammar&>,2l>const&,franca::TypeParser&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::matches>,0l>const&,boost::proto::___st::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[16]>,0l>>,2l>const&>,2l>>
            (local_108);
  pRVar12 = local_110;
  local_1c8._0_8_ = "method";
  local_1d8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &boost::spirit::matches;
  local_1d0 = (Rule<ast::Method_()> *)0x3eacfe;
  local_218._16_8_ = &local_238;
  local_200._0_8_ = &local_a0;
  local_160.name_._M_string_length = 0x3ead10;
  local_190.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       ((long)&local_160 + 0x10);
  local_188.members.obj_ptr = &local_a8;
  local_1a0._8_8_ = &local_80;
  local_1c8._16_8_ = local_1a0;
  local_1b0._M_allocated_capacity = (size_type)&stack0xfffffffffffffd9f;
  local_1e8._0_8_ = local_218 + 0x10;
  local_1e8._8_8_ = &local_78;
  local_70 = &local_60;
  local_68 = &stack0xfffffffffffffd9e;
  local_170 = &local_70;
  local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)&local_90;
  local_160.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_170;
  local_160.name_._M_dataplus._M_p = &stack0xfffffffffffffd9d;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_88;
  local_40._M_allocated_capacity = (long)"    error" + 4;
  local_1c8._8_8_ = uVar10;
  local_218._0_8_ = local_1c8;
  local_218._8_8_ = uVar11;
  local_238 = (Rule<std::string_()> *)local_218;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1d8;
  local_98._M_p = (pointer)&local_40;
  local_a0.manager._0_1_ = 0x7b;
  local_a8.manager._0_1_ = 0x7b;
  local_80 = local_110;
  uVar17 = 0x7d;
  pRVar9 = (Rule<ast::Version_()> *)(local_1c8 + 0x10);
  uVar16 = 0x7b;
  uVar15 = 0x7d;
  local_200._8_8_ = &local_228;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_98;
  local_1b0._M_local_buf[0xf] = '}';
  local_60._M_allocated_capacity = (long)"    out" + 4;
  local_90 = local_110;
  local_88 = &local_160;
  local_40._8_8_ = local_d8;
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_1a0._0_8_ = &local_190;
  local_78 = pRVar9;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_f7f04a1c_>(local_118);
  local_250.child0.ref.t_ =
       (proto_child0)
       (local_e0->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_248.ch = '}';
  boost::
  function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<boost::variant<std::__cxx11::string,std::vector<fidler::ast::Enumerator,std::allocator<fidler::ast::Enumerator>>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
  ::operator=((function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<boost::variant<std::__cxx11::string,std::vector<fidler::ast::Enumerator,std::allocator<fidler::ast::Enumerator>>>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
               *)&(this->error_).f,
              (parser_binder<boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffda0);
  local_250.child0.ref.t_ =
       *(proto_child0 *)
        &(local_b8->
         super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
         ).
         super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
         .proto_expr_.child0.ref;
  boost::
  function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<fidler::ast::Enumerator&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
  ::operator=((function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<fidler::ast::Enumerator&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
               *)&(this->enumerator_).f,
              (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::optional<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffda0);
  local_218._16_8_ = &local_238;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_190;
  local_1d0 = (Rule<ast::Method_()> *)((long)&local_160 + 0x10);
  local_1c8._16_8_ = local_1a0;
  local_238 = (Rule<std::string_()> *)0x3edbda;
  local_218._0_8_ = &boost::spirit::matches;
  local_218._8_8_ = "selective";
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_160;
  local_1a0._0_8_ = "out";
  local_1b0._M_allocated_capacity = (size_type)&local_170;
  local_1c8._0_8_ = &local_1d8;
  local_1c8._8_8_ = &local_70;
  local_200._8_8_ = &local_228;
  local_160.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_._0_1_ = 0x7b;
  local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)CONCAT71(local_170._1_7_,0x7b);
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT71(local_70._1_7_,0x7d);
  local_60._M_local_buf[0] = 0x7d;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_188._16_8_;
  local_200._0_8_ = uVar11;
  ppvVar8 = (vtable_base **)(local_218 + 0x10);
  local_1e8._8_8_ = local_218;
  local_160.name_._M_string_length = (size_type)pRVar12;
  local_1e8._0_8_ = ppvVar8;
  local_1d8.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)pRVar9;
  local_190.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_1c8;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Broadcast(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,franca::AnnotationGrammar&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<bo___exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_160.f.
             super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::Method_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
             .super_function_base.functor._8_8_);
  pIVar14 = local_c0;
  pTVar13 = local_100;
  local_218._16_8_ = "const";
  local_200._0_8_ = local_100;
  local_1c8[0] = 0x5b;
  local_1d8.manager._0_1_ = ']';
  local_218._8_8_ = &local_1d8;
  local_238 = (Rule<std::string_()> *)&boost::spirit::matches;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_218;
  local_1e8._8_8_ = &local_238;
  local_228 = (Rule<std::string_()> *)local_1e8;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar11;
  local_1c8[0x10] = 0x3d;
  local_200._8_8_ = &local_228;
  local_218._0_8_ = local_1c8;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pRVar9;
  local_1e8._0_8_ = ppvVar8;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::ConstantDef(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>,franca::TypeParser&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::matches>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,franca::InitializerParser&>,2l>>
            (local_188._8_8_);
  local_1c8[0] = 0x5b;
  local_1d8.manager._0_1_ = ']';
  local_200._0_8_ = &local_1d8;
  local_1e8._0_8_ = &boost::spirit::matches;
  local_228 = (Rule<std::string_()> *)pTVar13;
  local_200._8_8_ = &local_228;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar11;
  local_1c8[0x10] = 0x3d;
  local_230.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )pIVar14;
  local_218._0_8_ = &local_238;
  local_238 = (Rule<std::string_()> *)(local_1c8 + 0x10);
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8;
  local_218._16_8_ = local_1c8;
  local_1e8._8_8_ = ppvVar8;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<franca::TypeParser&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::matches>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,franca::InitializerParser&>,2l>const&>,1l>const&>,2l>>
            (local_110);
  boost::
  function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
  ::operator=((function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
               *)&(this->quoted_string_).f,
              (parser_binder<boost::spirit::qi::lexeme_directive<boost::spirit::qi::expect_operator<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::plus<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
               *)&stack0xfffffffffffffda0);
  uVar10 = local_160.name_.field_2._8_8_;
  f_00.p.subject._8_8_ = 0x2e;
  f_00.p.subject.left.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)*(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
              *)local_160.name_.field_2._8_8_;
  boost::
  function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
  ::operator=((function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
               *)&(this->fqn_).f,f_00);
  local_200._8_8_ = &local_228;
  local_1c8[0] = 0x5e;
  local_238 = (Rule<std::string_()> *)local_1c8;
  local_1d8.manager._0_1_ = 0x5f;
  local_1e8._0_8_ = &boost::spirit::standard::alpha;
  local_1e8._8_8_ = &local_1d8;
  local_228 = (Rule<std::string_()> *)&local_238;
  local_1c8[0x10] = 0x5f;
  local_218._16_8_ = &boost::spirit::standard::alnum;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218;
  cVar19.ch = -0xb;
  cVar21.subject =
       (difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>
        )0x3edf;
  cVar23.ch = '\0';
  uVar25 = 0;
  local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8;
  local_218._0_8_ = ppvVar8;
  local_200._0_8_ = (Rule<std::string_()> *)(local_1c8 + 0x10);
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,1l>const&>,2l>const&>,2l>>
            (uVar10);
  f.proto_expr_.child0.child0.fp._5_1_ = uVar15;
  f.proto_expr_.child0.child0.fp._0_5_ = in_stack_fffffffffffffd98;
  f.proto_expr_.child0.child0.fp._6_1_ = uVar16;
  f.proto_expr_.child0.child0.fp._7_1_ = uVar17;
  f.proto_expr_._8_1_ = cVar19.ch;
  f.proto_expr_._9_2_ = cVar21.subject;
  f.proto_expr_._11_1_ = cVar23.ch;
  f.proto_expr_._12_4_ = uVar25;
  boost::spirit::qi::
  on_error<(boost::spirit::qi::error_handler_result)0,char_const*,franca::SkipGrammar,fidler::ast::Model(),boost::spirit::unused_type,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::detail::function_ptr<void,void(*)(char_const*,char_const*,char_const*,boost::spirit::info_const&)>>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>>
            (local_f8,f);
  return;
}

Assistant:

ModelParser::ModelParser() :
		ModelParser::base_type(model_)
{
	namespace qi = boost::spirit::qi;
	using namespace boost::spirit::qi::labels;
	using boost::phoenix::at_c;
	using boost::phoenix::push_back;

	model_
		= "package"
		> fqn_                 [at_c<0>(_val) = _1]
		> *import_             [push_back(at_c<1>(_val), _1)]
		> *( type_collection_  [push_back(at_c<2>(_val), _1)]
		   | interface_        [push_back(at_c<3>(_val), _1)]
		   )
		> qi::eoi
		;

	import_
		= "import"
		//> qi::omit["model" | (qi::lexeme[fqn_ > -qi::lit(".*")] > "from")]
		> qi::omit["model" | (fqn_ > -qi::lit(".*") > "from")]
		> quoted_string_
		;

	type_collection_
		%= "typeCollection"
		> annotation_
		> -id_
		> '{'
		> -version_
		> *type_definition_
		> *constant_def_
		> '}'
		;

	interface_
		%= "interface"
		> annotation_
		> id_
		> -("extends" > fqn_)
		> -("manages" > (id_ % ','))
		> '{'
		> -version_
		> *attribute_
		> *method_
		> *broadcast_
		> -contract_
		> *type_definition_
		> *constant_def_
		> '}'
		;

	version_
		%= qi::lit("version")
		> '{'
		> qi::lit("major") > qi::int_
		> qi::lit("minor") > qi::int_
		> '}'
		;

	attribute_
		%= "attribute"
		> annotation_
		> type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> qi::matches["readonly"]
		> qi::matches["noSubscriptions"]
		;

	method_
		%= "method"
		> annotation_
		> id_
		> qi::matches["fireAndForget"]
		> '{'
		> -(qi::lit("in")  > '{' > *argument_ > '}')
		> -(qi::lit("out") > '{' > *argument_ > '}')
		> -("error" > error_)
		> '}'
		;

	error_
		%= fqn_
		| ('{' > *enumerator_ > '}')
		;

	enumerator_
		%= id_
		>> -('=' > expression_)
		;

	broadcast_
		%= "broadcast"
		> annotation_
		> id_
		> qi::matches["selective"]
		> '{'
		> -(qi::lit("out") > '{' > *argument_ > '}')
		> '}'
		;

	constant_def_
		%= "const"
		> type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> '='
		> initializer_
		;

	argument_
		%= type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> -('=' > initializer_)
		;

	quoted_string_
		%= qi::lexeme['"' > +(qi::char_ - '"') > '"']
		;

	fqn_
		%= qi::raw[id_ % '.']
		//%= qi::lexeme[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | qi::char_('_')) >> *(qi::alnum | qi::char_('_'))]
		;

	qi::on_error<qi::fail>(model_,
			boost::phoenix::bind(error_handler, _1, _2, _3, _4));
}